

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGetProcAddressTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GetProcAddressCoreFunctionsCase::executeTest(GetProcAddressCoreFunctionsCase *this)

{
  CallLogWrapper *this_00;
  uint uVar1;
  TestLog *pTVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  deUint32 err;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  Library *egl;
  __eglMustCastToProperFunctionPointerType p_Var8;
  size_t sVar9;
  qpTestResult testResult;
  char *pcVar10;
  TestContext *this_01;
  long lVar11;
  long local_1e8;
  undefined **local_1e0;
  ConfigAttribValueFmt local_1b8;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  pTVar2 = ((this->super_GetProcAddressCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
  local_1b0 = (undefined1  [8])local_1a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0,"EGL_KHR_get_all_proc_addresses","");
  pbVar3 = (this->super_GetProcAddressCase).m_supported.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  _Var7 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    ((this->super_GetProcAddressCase).m_supported.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,pbVar3,local_1b0);
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
  }
  egl = EglTestContext::getLibrary((this->super_GetProcAddressCase).super_TestCase.m_eglTestCtx);
  uVar6 = eglu::getRenderableAPIsMask(egl,(this->super_GetProcAddressCase).m_display);
  uVar1 = this->m_apiBit;
  bVar4 = true;
  if ((int)uVar1 < 4) {
    if (uVar1 == 0) {
      local_1e8 = 0x22;
      local_1e0 = (undefined **)egl::(anonymous_namespace)::s_EGL14;
      goto LAB_00e72bb1;
    }
    if (uVar1 == 1) {
      local_1e8 = 0x90;
      local_1e0 = &egl::(anonymous_namespace)::s_GLES10;
      goto LAB_00e72bb1;
    }
  }
  else {
    if (uVar1 == 4) {
      local_1e8 = 0x8e;
      local_1e0 = (undefined **)egl::(anonymous_namespace)::s_GLES20;
      goto LAB_00e72bb1;
    }
    if (uVar1 == 0x40) {
      local_1e8 = 0x68;
      local_1e0 = (undefined **)egl::(anonymous_namespace)::s_GLES30;
      goto LAB_00e72bb1;
    }
  }
  local_1e0 = (undefined **)0x0;
  bVar4 = false;
  local_1e8 = 0;
LAB_00e72bb1:
  local_1b0 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"EGL_KHR_get_all_proc_addresses: ",0x20);
  pcVar10 = "not supported";
  if (_Var7._M_current != pbVar3) {
    pcVar10 = "supported";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,pcVar10,(ulong)(_Var7._M_current == pbVar3) * 4 + 9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  local_1b0 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  uVar6 = uVar6 & uVar1;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  if (uVar6 != uVar1) {
    local_1b0 = (undefined1  [8])pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    local_1b8 = (ConfigAttribValueFmt)((ulong)(uint)this->m_apiBit << 0x20 | 0x3040);
    eglu::operator<<((ostream *)&local_1a8,&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," not supported by any available configuration.",0x2e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    local_1b0 = (undefined1  [8])pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if (bVar4) {
    this_00 = &(this->super_GetProcAddressCase).super_CallLogWrapper;
    if ((uint)local_1e8 < 2) {
      local_1e8 = 1;
    }
    lVar11 = 0;
    do {
      pcVar10 = local_1e0[lVar11];
      p_Var8 = eglu::CallLogWrapper::eglGetProcAddress(this_00,pcVar10);
      err = eglu::CallLogWrapper::eglGetError(this_00);
      eglu::checkError(err,"eglGetProcAddress()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGetProcAddressTests.cpp"
                       ,0xff);
      iVar5 = (int)(ostringstream *)&local_1a8;
      if ((_Var7._M_current == pbVar3) ||
         (p_Var8 != (__eglMustCastToProperFunctionPointerType)0x0 || uVar6 != uVar1)) {
        if ((uVar6 != uVar1) && (p_Var8 != (__eglMustCastToProperFunctionPointerType)0x0)) {
          local_1b0 = (undefined1  [8])pTVar2;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,
                     "Warning, received non-null value for unsupported function: ",0x3b);
          if (pcVar10 == (char *)0x0) {
            std::ios::clear(iVar5 + (int)local_1a8[-3]);
          }
          else {
            sVar9 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar10,sVar9);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::ios_base::~ios_base(local_138);
          this_01 = (this->super_GetProcAddressCase).super_TestCase.super_TestCase.super_TestNode.
                    m_testCtx;
          testResult = QP_TEST_RESULT_QUALITY_WARNING;
          pcVar10 = "Non-null value for unsupported function";
          goto LAB_00e72f32;
        }
      }
      else {
        local_1b0 = (undefined1  [8])pTVar2;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Fail, received null pointer for supported function: ",0x34
                  );
        if (pcVar10 == (char *)0x0) {
          std::ios::clear(iVar5 + (int)local_1a8[-3]);
        }
        else {
          sVar9 = strlen(pcVar10);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar10,sVar9);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        this_01 = (this->super_GetProcAddressCase).super_TestCase.super_TestCase.super_TestNode.
                  m_testCtx;
        testResult = QP_TEST_RESULT_FAIL;
        pcVar10 = "Unexpected null pointer";
LAB_00e72f32:
        tcu::TestContext::setTestResult(this_01,testResult,pcVar10);
      }
      lVar11 = lVar11 + 1;
    } while (local_1e8 != lVar11);
  }
  return;
}

Assistant:

void executeTest (void)
	{
		TestLog&				log					= m_testCtx.getLog();
		const bool				funcPtrSupported	= isSupported("EGL_KHR_get_all_proc_addresses");
		const bool				apiSupported		= (eglu::getRenderableAPIsMask(m_eglTestCtx.getLibrary(), m_display) & m_apiBit) == m_apiBit;
		const FunctionNames		funcNames			= getCoreFunctionNames(m_apiBit);

		log << TestLog::Message << "EGL_KHR_get_all_proc_addresses: " << (funcPtrSupported ? "supported" : "not supported") << TestLog::EndMessage;
		log << TestLog::Message << TestLog::EndMessage;

		if (!apiSupported)
		{
			log << TestLog::Message << eglu::getConfigAttribValueStr(EGL_RENDERABLE_TYPE, m_apiBit) << " not supported by any available configuration." << TestLog::EndMessage;
			log << TestLog::Message << TestLog::EndMessage;
		}

		for (int funcNdx = 0; funcNdx < funcNames.numFunctions; funcNdx++)
		{
			const char*	funcName			= funcNames.functions[funcNdx];
			void		(*funcPtr)(void);

			funcPtr = eglGetProcAddress(funcName);
			eglu::checkError(eglGetError(), "eglGetProcAddress()", __FILE__, __LINE__);

			if (apiSupported && funcPtrSupported && (funcPtr == 0))
			{
				log << TestLog::Message << "Fail, received null pointer for supported function: " << funcName << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Unexpected null pointer");
			}
			else if (!apiSupported && (funcPtr != 0))
			{
				log << TestLog::Message << "Warning, received non-null value for unsupported function: " << funcName << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Non-null value for unsupported function");
			}
		}
	}